

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

InteractResult * __thiscall
net_tests::anon_unknown_17::V2TransportTester::Interact(V2TransportTester *this)

{
  bool bVar1;
  bool bVar2;
  V2Transport *pVVar3;
  unsigned_long uVar4;
  undefined8 *in_RSI;
  optional<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  size_t to_receive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_msg_type;
  type *_more;
  type *recv_bytes;
  size_t old_len;
  bool progress;
  bool reject;
  Span<const_unsigned_char> to_send;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> ret;
  CNetMessage msg;
  CNetMessage *in_stack_fffffffffffffe08;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
  *in_stack_fffffffffffffe10;
  Span<unsigned_char> *in_stack_fffffffffffffe18;
  V2Transport *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe38;
  V2Transport *in_stack_fffffffffffffe40;
  const_iterator __last;
  iterator in_stack_fffffffffffffe58;
  V2Transport *in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  bool *in_stack_fffffffffffffe90;
  V2Transport *in_stack_fffffffffffffe98;
  Span<const_unsigned_char> *in_stack_fffffffffffffea0;
  V2Transport *in_stack_fffffffffffffea8;
  V2Transport *in_stack_fffffffffffffec8;
  V2Transport *in_stack_fffffffffffffed0;
  microseconds in_stack_ffffffffffffff10;
  undefined1 local_d8 [15];
  byte local_c9;
  uchar *local_c8;
  uchar *local_c0;
  uchar *local_b0;
  Span<unsigned_char> local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::vector
            ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
             in_stack_fffffffffffffe08);
  do {
    bVar2 = false;
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe18);
    if (!bVar1) {
      Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_fffffffffffffe18,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe68._M_current = (uchar *)*in_RSI;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe08)
      ;
      RandomMixin<FastRandomContext>::randrange<unsigned_long>
                (in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28._M_current);
      local_90 = Span<unsigned_char>::first
                           (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
      Span<const_unsigned_char>::Span<unsigned_char,_0>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffe08,
                 (Span<unsigned_char> *)0x874b30);
      in_stack_fffffffffffffe60 =
           (V2Transport *)
           Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
      bVar2 = V2Transport::ReceivedBytes(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      if (!bVar2) {
        std::
        optional<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ::optional(in_RDI);
        goto LAB_00874fc8;
      }
      in_stack_fffffffffffffec8 = in_stack_fffffffffffffe60;
      pVVar3 = (V2Transport *)
               Span<const_unsigned_char>::size
                         ((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
      bVar2 = in_stack_fffffffffffffe60 != pVVar3;
      if (bVar2) {
        __last._M_current = (uchar *)(in_RSI + 0x117);
        local_b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffe10);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe18,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe10);
        local_c8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffe10);
        Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
        local_c0 = (uchar *)__gnu_cxx::
                            __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)in_stack_fffffffffffffe18,
                                        (difference_type)in_stack_fffffffffffffe10);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe18,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe58 =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffe30,in_stack_fffffffffffffe58._M_current,__last);
      }
    }
    bVar1 = V2Transport::ReceivedMessageComplete(in_stack_fffffffffffffe20);
    if ((bVar1) &&
       ((!bVar2 ||
        (bVar1 = RandomMixin<FastRandomContext>::randbool
                           ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe08), bVar1))))
    {
      local_c9 = 0;
      in_stack_fffffffffffffe40 = (V2Transport *)(in_RSI + 1);
      memset(local_d8,0,8);
      V2Transport::GetReceivedMessage
                (in_stack_fffffffffffffe98,in_stack_ffffffffffffff10,in_stack_fffffffffffffe90);
      if ((local_c9 & 1) == 0) {
        std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
        emplace_back<CNetMessage>
                  ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                    *)in_stack_fffffffffffffe28._M_current,(CNetMessage *)in_stack_fffffffffffffe20)
        ;
      }
      else {
        std::vector<std::optional<CNetMessage>,std::allocator<std::optional<CNetMessage>>>::
        emplace_back<std::nullopt_t_const&>
                  ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                    *)in_stack_fffffffffffffe28._M_current,(nullopt_t *)in_stack_fffffffffffffe20);
      }
      bVar2 = true;
      CNetMessage::~CNetMessage(in_stack_fffffffffffffe08);
    }
    bVar1 = std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::empty
                      ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                       in_stack_fffffffffffffe08);
    if ((!bVar1) &&
       ((!bVar2 ||
        (bVar1 = RandomMixin<FastRandomContext>::randbool
                           ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe08), bVar1))))
    {
      in_stack_fffffffffffffe38 = (uchar *)(in_RSI + 1);
      std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::front
                ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                 in_stack_fffffffffffffe18);
      bVar1 = V2Transport::SetMessageToSend
                        (in_stack_fffffffffffffed0,(CSerializedNetMsg *)in_stack_fffffffffffffec8);
      if (bVar1) {
        std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::pop_front
                  ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
                   in_stack_fffffffffffffe08);
        bVar2 = true;
      }
    }
    in_stack_fffffffffffffe30 = (RandomMixin<FastRandomContext> *)(in_RSI + 1);
    std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::empty
              ((deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_> *)
               in_stack_fffffffffffffe08);
    V2Transport::GetBytesToSend_abi_cxx11_
              (in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
    in_stack_fffffffffffffea8 =
         (V2Transport *)
         std::get<0ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                   ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffea0 =
         (Span<const_unsigned_char> *)
         std::get<1ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                   ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe98 =
         (V2Transport *)
         std::get<2ul,Span<unsigned_char_const>,bool,std::__cxx11::string_const&>
                   ((tuple<Span<const_unsigned_char>,_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     *)in_stack_fffffffffffffe08);
    bVar1 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)in_stack_fffffffffffffe08)
    ;
    if ((!bVar1) &&
       ((!bVar2 ||
        (bVar1 = RandomMixin<FastRandomContext>::randbool
                           ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe08), bVar1))))
    {
      in_stack_fffffffffffffe10 =
           (vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
           *in_RSI;
      Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
      uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                        (in_stack_fffffffffffffe30,
                         (unsigned_long)in_stack_fffffffffffffe28._M_current);
      in_stack_fffffffffffffe90 = (bool *)(uVar4 + 1);
      in_stack_fffffffffffffe18 = (Span<unsigned_char> *)(in_RSI + 0x11a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffe18,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe20 =
           (V2Transport *)
           Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
      Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe28 =
           std::vector<unsigned_char,std::allocator<unsigned_char>>::
           insert<unsigned_char_const*,void>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffe40,in_stack_fffffffffffffe68,in_stack_fffffffffffffe38,
                      (uchar *)in_stack_fffffffffffffe30);
      bVar2 = true;
      V2Transport::MarkBytesSent
                (in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58._M_current);
    }
  } while (bVar2);
  std::
  optional<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>::
  optional<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true>
            ((optional<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
              *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
LAB_00874fc8:
  std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::~vector
            ((vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> *)
             in_stack_fffffffffffffe18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

InteractResult Interact()
    {
        std::vector<std::optional<CNetMessage>> ret;
        while (true) {
            bool progress{false};
            // Send bytes from m_to_send to the transport.
            if (!m_to_send.empty()) {
                Span<const uint8_t> to_send = Span{m_to_send}.first(1 + m_rng.randrange(m_to_send.size()));
                size_t old_len = to_send.size();
                if (!m_transport.ReceivedBytes(to_send)) {
                    return std::nullopt; // transport error occurred
                }
                if (old_len != to_send.size()) {
                    progress = true;
                    m_to_send.erase(m_to_send.begin(), m_to_send.begin() + (old_len - to_send.size()));
                }
            }
            // Retrieve messages received by the transport.
            if (m_transport.ReceivedMessageComplete() && (!progress || m_rng.randbool())) {
                bool reject{false};
                auto msg = m_transport.GetReceivedMessage({}, reject);
                if (reject) {
                    ret.emplace_back(std::nullopt);
                } else {
                    ret.emplace_back(std::move(msg));
                }
                progress = true;
            }
            // Enqueue a message to be sent by the transport to us.
            if (!m_msg_to_send.empty() && (!progress || m_rng.randbool())) {
                if (m_transport.SetMessageToSend(m_msg_to_send.front())) {
                    m_msg_to_send.pop_front();
                    progress = true;
                }
            }
            // Receive bytes from the transport.
            const auto& [recv_bytes, _more, _msg_type] = m_transport.GetBytesToSend(!m_msg_to_send.empty());
            if (!recv_bytes.empty() && (!progress || m_rng.randbool())) {
                size_t to_receive = 1 + m_rng.randrange(recv_bytes.size());
                m_received.insert(m_received.end(), recv_bytes.begin(), recv_bytes.begin() + to_receive);
                progress = true;
                m_transport.MarkBytesSent(to_receive);
            }
            if (!progress) break;
        }
        return ret;
    }